

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeezenet.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  undefined8 *in_RSI;
  int in_EDI;
  vector<float,_std::allocator<float>_> cls_scores;
  Mat m;
  vector<float,_std::allocator<float>_> *in_stack_00000080;
  Mat *in_stack_00000088;
  char *imagepath;
  allocator *this;
  allocator local_99;
  string local_98 [32];
  string local_78 [4];
  int in_stack_ffffffffffffff8c;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff90;
  int local_4;
  
  if (in_EDI == 2) {
    pcVar1 = (char *)in_RSI[1];
    this = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,this);
    cv::imread(local_78,(int)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    bVar2 = cv::Mat::empty();
    if ((bVar2 & 1) == 0) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1658e5);
      detect_squeezenet(in_stack_00000088,in_stack_00000080);
      print_topk(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_4 = 0;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)this);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      local_4 = -1;
    }
    cv::Mat::~Mat((Mat *)local_78);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_squeezenet(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}